

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O3

bool __thiscall
argvParser::checkNextArgumentIfEnum(argvParser *this,argument *arg,char *nextElement)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  bool bVar5;
  long *local_f0;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar5 = true;
  if (arg != (argument *)0x0) {
    iVar1 = std::__cxx11::string::compare((char *)&arg->enums);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_d0,nextElement,(allocator *)&local_b0);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_e0 = *plVar4;
        lStack_d8 = plVar2[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar4;
        local_f0 = (long *)*plVar2;
      }
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      lVar3 = std::__cxx11::string::find((char *)&arg->enums,(ulong)local_f0,0);
      if (local_f0 != &local_e0) {
        operator_delete(local_f0);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0);
      }
      if ((lVar3 == -1) && ((arg->enums)._M_string_length != 0)) {
        std::__cxx11::string::_M_assign
                  ((string *)&(this->super_argParserAdvancedConfiguration).lastFailedArg);
        std::operator+(&local_50,"\"",&arg->argLong);
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_80 = *plVar4;
          lStack_78 = plVar2[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar4;
          local_90 = (long *)*plVar2;
        }
        local_88 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_90,(ulong)(arg->enums)._M_dataplus._M_p);
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_60 = *plVar4;
          lStack_58 = plVar2[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar4;
          local_70 = (long *)*plVar2;
        }
        local_68 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_a0 = *plVar4;
          lStack_98 = plVar2[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar4;
          local_b0 = (long *)*plVar2;
        }
        local_a8 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_c0 = *plVar4;
          lStack_b8 = plVar2[3];
          local_d0 = &local_c0;
        }
        else {
          local_c0 = *plVar4;
          local_d0 = (long *)*plVar2;
        }
        local_c8 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_e0 = *plVar4;
          lStack_d8 = plVar2[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *plVar4;
          local_f0 = (long *)*plVar2;
        }
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)&(this->super_argParserAdvancedConfiguration).errorMessage,
                   (ulong)local_f0);
        if (local_f0 != &local_e0) {
          operator_delete(local_f0);
        }
        if (local_d0 != &local_c0) {
          operator_delete(local_d0);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0);
        }
        if (local_70 != &local_60) {
          operator_delete(local_70);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        bVar5 = false;
      }
    }
  }
  return bVar5;
}

Assistant:

bool argvParser::checkNextArgumentIfEnum(argument * arg, char *nextElement) {

    if (arg != nullptr && arg->enums != "") {
        if (arg->enums.find(string(nextElement) + " ") != string::npos)
            return true;
        else if (!arg->enums.empty()) {
            lastFailedArg = arg->argLong;
            errorMessage += "\"" + arg->argLong + "\" does  accept \"" + arg->enums + "\" but not \"" +
                            nextElement + "\"\n";
            return false;
        }


    }
    return true;
}